

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_pss.cc
# Opt level: O0

int x509_rsa_ctx_to_pss(EVP_MD_CTX *ctx,X509_ALGOR *algor)

{
  EVP_MD *alg;
  int iVar1;
  RSA_PSS_PARAMS *a;
  ASN1_INTEGER *pAVar2;
  ASN1_STRING *pAVar3;
  ASN1_OBJECT *aobj;
  RSA_PSS_PARAMS *pss;
  ASN1_STRING *os;
  int local_38;
  int ret;
  int md_len;
  int saltlen;
  EVP_MD *mgf1md;
  EVP_MD *sigmd;
  X509_ALGOR *algor_local;
  EVP_MD_CTX *ctx_local;
  
  sigmd = (EVP_MD *)algor;
  algor_local = (X509_ALGOR *)ctx;
  iVar1 = EVP_PKEY_CTX_get_signature_md(ctx->pctx,&mgf1md);
  if (((iVar1 == 0) ||
      (iVar1 = EVP_PKEY_CTX_get_rsa_mgf1_md
                         ((EVP_PKEY_CTX *)algor_local[1].algorithm,(EVP_MD **)&md_len), iVar1 == 0))
     || (iVar1 = EVP_PKEY_CTX_get_rsa_pss_saltlen((EVP_PKEY_CTX *)algor_local[1].algorithm,&ret),
        iVar1 == 0)) {
    ctx_local._4_4_ = 0;
  }
  else if ((mgf1md == _md_len) && (iVar1 = is_allowed_pss_md(mgf1md), iVar1 != 0)) {
    local_38 = EVP_MD_size((EVP_MD *)mgf1md);
    iVar1 = local_38;
    if ((ret == -1) || (iVar1 = ret, ret == local_38)) {
      ret = iVar1;
      os._4_4_ = 0;
      pss = (RSA_PSS_PARAMS *)0x0;
      a = RSA_PSS_PARAMS_new();
      if (a != (RSA_PSS_PARAMS *)0x0) {
        if (ret == 0x14) {
          __assert_fail("saltlen != 20",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/rsa_pss.cc"
                        ,0xb9,"int x509_rsa_ctx_to_pss(EVP_MD_CTX *, X509_ALGOR *)");
        }
        pAVar2 = ASN1_INTEGER_new();
        a->saltLength = pAVar2;
        if (((a->saltLength != (ASN1_INTEGER *)0x0) &&
            (iVar1 = ASN1_INTEGER_set_int64((ASN1_INTEGER *)a->saltLength,(long)ret), iVar1 != 0))
           && ((iVar1 = rsa_md_to_algor((X509_ALGOR **)a,mgf1md), iVar1 != 0 &&
               ((iVar1 = rsa_md_to_mgf1((X509_ALGOR **)&a->maskGenAlgorithm,_md_len), iVar1 != 0 &&
                (pAVar3 = ASN1_item_pack(a,(ASN1_ITEM *)&RSA_PSS_PARAMS_it,
                                         (ASN1_OCTET_STRING **)&pss), alg = sigmd,
                pAVar3 != (ASN1_STRING *)0x0)))))) {
          aobj = OBJ_nid2obj(0x390);
          iVar1 = X509_ALGOR_set0((X509_ALGOR *)alg,aobj,0x10,pss);
          if (iVar1 != 0) {
            pss = (RSA_PSS_PARAMS *)0x0;
            os._4_4_ = 1;
          }
        }
      }
      RSA_PSS_PARAMS_free(a);
      ASN1_STRING_free((ASN1_STRING *)pss);
      ctx_local._4_4_ = os._4_4_;
    }
    else {
      ERR_put_error(0xb,0,0x70,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/rsa_pss.cc"
                    ,0xad);
      ctx_local._4_4_ = 0;
    }
  }
  else {
    ERR_put_error(0xb,0,0x70,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/rsa_pss.cc"
                  ,0xa6);
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int x509_rsa_ctx_to_pss(EVP_MD_CTX *ctx, X509_ALGOR *algor) {
  const EVP_MD *sigmd, *mgf1md;
  int saltlen;
  if (!EVP_PKEY_CTX_get_signature_md(ctx->pctx, &sigmd) ||
      !EVP_PKEY_CTX_get_rsa_mgf1_md(ctx->pctx, &mgf1md) ||
      !EVP_PKEY_CTX_get_rsa_pss_saltlen(ctx->pctx, &saltlen)) {
    return 0;
  }

  if (sigmd != mgf1md || !is_allowed_pss_md(sigmd)) {
    OPENSSL_PUT_ERROR(X509, X509_R_INVALID_PSS_PARAMETERS);
    return 0;
  }
  int md_len = (int)EVP_MD_size(sigmd);
  if (saltlen == -1) {
    saltlen = md_len;
  } else if (saltlen != md_len) {
    OPENSSL_PUT_ERROR(X509, X509_R_INVALID_PSS_PARAMETERS);
    return 0;
  }

  int ret = 0;
  ASN1_STRING *os = NULL;
  RSA_PSS_PARAMS *pss = RSA_PSS_PARAMS_new();
  if (!pss) {
    goto err;
  }

  // The DEFAULT value is 20, but this does not match any supported digest.
  assert(saltlen != 20);
  pss->saltLength = ASN1_INTEGER_new();
  if (!pss->saltLength ||  //
      !ASN1_INTEGER_set_int64(pss->saltLength, saltlen)) {
    goto err;
  }

  if (!rsa_md_to_algor(&pss->hashAlgorithm, sigmd) ||
      !rsa_md_to_mgf1(&pss->maskGenAlgorithm, mgf1md)) {
    goto err;
  }

  // Finally create string with pss parameter encoding.
  if (!ASN1_item_pack(pss, ASN1_ITEM_rptr(RSA_PSS_PARAMS), &os)) {
    goto err;
  }

  if (!X509_ALGOR_set0(algor, OBJ_nid2obj(NID_rsassaPss), V_ASN1_SEQUENCE,
                       os)) {
    goto err;
  }
  os = NULL;
  ret = 1;

err:
  RSA_PSS_PARAMS_free(pss);
  ASN1_STRING_free(os);
  return ret;
}